

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::decide_to_pick_charge(particleSamples *this,int monval)

{
  int iVar1;
  uint in_ESI;
  int charge;
  int pick_flag;
  int in_stack_ffffffffffffffec;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = particle_decay::get_particle_charge
                    ((particle_decay *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec);
  if (iVar1 < 0) {
    iVar2 = -1;
  }
  else if (0 < iVar1) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int particleSamples::decide_to_pick_charge(int monval) {
    int pick_flag = 0;
    int charge = decayer_ptr->get_particle_charge(monval);
    if (charge < 0)
        pick_flag = -1;
    else if (charge > 0)
        pick_flag = 1;
    return (pick_flag);
}